

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

ostream * AixLog::operator<<(ostream *os,Timestamp *timestamp)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  undefined8 uVar3;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  poVar2 = (ostream *)&std::clog;
  if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) != 0) {
    poVar2 = (ostream *)
             __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                     *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                            &Log::typeinfo,0);
    if (poVar2 != (ostream *)0x0) {
      __mutex = (pthread_mutex_t *)(poVar2 + 0x148);
      iVar1 = pthread_mutex_lock(__mutex);
      if (iVar1 == 0) {
        poVar2[0x120] = os[0x10];
        *(undefined8 *)(poVar2 + 0x118) = *(undefined8 *)(os + 8);
        iVar1 = pthread_mutex_unlock(__mutex);
        return (ostream *)CONCAT44(extraout_var,iVar1);
      }
      uVar3 = std::__throw_system_error(iVar1);
      if ((ostream *)local_58._0_8_ != (ostream *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      if ((pthread_mutex_t *)local_38._M_dataplus._M_p != __mutex) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
  }
  if (os[0x10] == (ostream)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"%Y-%m-%d %H-%M-%S.#ms","");
    Timestamp::to_string((string *)local_58,(Timestamp *)os,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,(char *)local_58._0_8_,local_58._8_8_);
    poVar2 = (ostream *)(local_58 + 0x10);
    if ((ostream *)local_58._0_8_ != poVar2) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      poVar2 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      poVar2 = extraout_RAX_00;
    }
  }
  return poVar2;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}